

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineQueryResultVideo.h
# Opt level: O2

void __thiscall TgBot::InlineQueryResultVideo::InlineQueryResultVideo(InlineQueryResultVideo *this)

{
  InlineQueryResult::InlineQueryResult(&this->super_InlineQueryResult);
  (this->super_InlineQueryResult)._vptr_InlineQueryResult =
       (_func_int **)&PTR__InlineQueryResultVideo_002cf628;
  (this->videoUrl)._M_dataplus._M_p = (pointer)&(this->videoUrl).field_2;
  (this->videoUrl)._M_string_length = 0;
  (this->videoUrl).field_2._M_local_buf[0] = '\0';
  (this->mimeType)._M_dataplus._M_p = (pointer)&(this->mimeType).field_2;
  (this->mimeType)._M_string_length = 0;
  (this->mimeType).field_2._M_local_buf[0] = '\0';
  (this->thumbUrl)._M_dataplus._M_p = (pointer)&(this->thumbUrl).field_2;
  (this->thumbUrl)._M_string_length = 0;
  (this->thumbUrl).field_2._M_local_buf[0] = '\0';
  (this->description)._M_dataplus._M_p = (pointer)&(this->description).field_2;
  (this->description)._M_string_length = 0;
  (this->description).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&(this->super_InlineQueryResult).type);
  this->videoWidth = 0;
  this->videoHeight = 0;
  this->videoDuration = 0;
  return;
}

Assistant:

InlineQueryResultVideo() {
        this->type = TYPE;
        this->videoWidth = 0;
        this->videoHeight = 0;
        this->videoDuration = 0;
    }